

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O2

uint __thiscall
s2coding::EncodedUintVector<unsigned_int>::operator[](EncodedUintVector<unsigned_int> *this,int i)

{
  uint uVar1;
  S2LogMessage SStack_18;
  
  if ((-1 < i) && ((uint)i < this->size_)) {
    uVar1 = GetUintWithLength<unsigned_int>(this->data_ + i * (uint)this->len_,(uint)this->len_);
    return uVar1;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
             ,0xf6,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: i >= 0 && i < size_ ");
  abort();
}

Assistant:

inline T EncodedUintVector<T>::operator[](int i) const {
  S2_DCHECK(i >= 0 && i < size_);
  return GetUintWithLength<T>(data_ + i * len_, len_);
}